

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * duckdb::QueryProfiler::JSONSanitize(string *__return_storage_ptr__,string *text)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar2 = (text->_M_dataplus)._M_p;
  sVar3 = text->_M_string_length;
  sVar4 = 0;
  do {
    if (sVar3 == sVar4) {
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[sVar4];
    switch(cVar1) {
    case '\b':
      break;
    case '\t':
      break;
    case '\n':
      break;
    case '\v':
switchD_00455d57_caseD_b:
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      goto LAB_00455dac;
    case '\f':
      break;
    case '\r':
      break;
    default:
      if ((cVar1 != '\"') && (cVar1 != '\\')) goto switchD_00455d57_caseD_b;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00455dac:
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

string QueryProfiler::JSONSanitize(const std::string &text) {
	string result;
	result.reserve(text.size());
	for (char i : text) {
		switch (i) {
		case '\b':
			result += "\\b";
			break;
		case '\f':
			result += "\\f";
			break;
		case '\n':
			result += "\\n";
			break;
		case '\r':
			result += "\\r";
			break;
		case '\t':
			result += "\\t";
			break;
		case '"':
			result += "\\\"";
			break;
		case '\\':
			result += "\\\\";
			break;
		default:
			result += i;
			break;
		}
	}
	return result;
}